

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                  parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int a;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *local_50;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_rowcol_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_rowcol_cold_6();
  }
  else if (open < 0) {
    parasail_nw_rowcol_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_rowcol_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_rowcol_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_rowcol_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar4 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_rowcol_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar4 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar4;
    ppVar3 = parasail_result_new_rowcol1(a,s2Len);
    if (ppVar3 != (parasail_result_t *)0x0) {
      ppVar3->flag = ppVar3->flag | 0x1440101;
      ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(s2Len + 1));
      ptr_01 = parasail_memalign_int(0x10,(ulong)(s2Len + 1));
      if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
        if (matrix->type == 0) {
          local_50 = parasail_memalign_int(0x10,(long)a);
          if (local_50 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < a) {
            piVar2 = matrix->mapper;
            uVar8 = 0;
            do {
              local_50[uVar8] = piVar2[(byte)_s1[uVar8]];
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
        }
        else {
          local_50 = (int *)0x0;
        }
        piVar2 = matrix->mapper;
        uVar4 = 1;
        if (1 < s2Len) {
          uVar4 = (ulong)(uint)s2Len;
        }
        uVar8 = 0;
        do {
          ptr[uVar8] = piVar2[(byte)_s2[uVar8]];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        iVar5 = -open;
        uVar8 = 0;
        do {
          ptr_00[uVar8 + 1] = iVar5;
          ptr_01[uVar8 + 1] = -0x40000000;
          iVar5 = iVar5 - gap;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        if (0 < a) {
          uVar8 = 1;
          do {
            if (matrix->type == 0) {
              lVar7 = (long)matrix->size;
              iVar5 = local_50[uVar8 - 1];
            }
            else {
              lVar7 = uVar8 - 1;
              iVar5 = matrix->size;
            }
            piVar2 = matrix->matrix;
            iVar11 = *ptr_00;
            iVar12 = -(((int)uVar8 + -1) * gap + open);
            *ptr_00 = iVar12;
            iVar6 = -0x40000000;
            uVar10 = 0;
            do {
              iVar1 = ptr_00[uVar10 + 1];
              iVar13 = iVar1 - open;
              iVar9 = ptr_01[uVar10 + 1] - gap;
              if (ptr_01[uVar10 + 1] - gap < iVar13) {
                iVar9 = iVar13;
              }
              ptr_01[uVar10 + 1] = iVar9;
              iVar13 = iVar6 - gap;
              iVar6 = iVar12 - open;
              if (iVar12 - open <= iVar13) {
                iVar6 = iVar13;
              }
              iVar12 = iVar11 + piVar2[iVar5 * lVar7 + (long)ptr[uVar10]];
              if (iVar12 <= iVar6) {
                iVar12 = iVar6;
              }
              if (iVar12 <= iVar9) {
                iVar12 = iVar9;
              }
              ptr_00[uVar10 + 1] = iVar12;
              uVar10 = uVar10 + 1;
              iVar11 = iVar1;
            } while (uVar4 != uVar10);
            ((ppVar3->field_4).rowcols)->score_col[uVar8 - 1] = iVar12;
            uVar8 = uVar8 + 1;
          } while (uVar8 != a + 1);
        }
        uVar4 = 1;
        if (1 < s2Len) {
          uVar4 = (ulong)(uint)s2Len;
        }
        uVar8 = 0;
        do {
          ((ppVar3->field_4).rowcols)->score_row[uVar8] = ptr_00[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        ppVar3->score = ptr_00[(uint)s2Len];
        ppVar3->end_query = a + -1;
        ppVar3->end_ref = s2Len + -1;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_50);
          return ppVar3;
        }
        return ppVar3;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open -(j-1)*gap;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->rowcols->score_row[j-1] = H[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}